

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestNestedMessageEnum::_InternalSerialize
          (TestNestedMessageEnum *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  TestMessageEnum *value;
  bool bVar1;
  anon_union_40_1_493b367e_for_TestNestedMessageEnum_3 aVar2;
  int iVar3;
  const_reference piVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  char *in_R9;
  int index;
  byte *pbVar8;
  undefined8 *puVar9;
  string_view s;
  string_view field_name;
  
  this_00 = &(this->field_0)._impl_.direct_enum_;
  iVar3 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,
                     (undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x4) ==
                     (undefined1  [40])0x0);
  if (0 < iVar3) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar4 = google::protobuf::RepeatedField<int>::Get(this_00,index);
      uVar5 = (ulong)*piVar4;
      pbVar8 = target + 1;
      *target = 8;
      uVar7 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar8 = (byte)uVar7 | 0x80;
          uVar5 = uVar7 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar5;
        } while (bVar1);
      }
      *pbVar8 = (byte)uVar5;
      target = pbVar8 + 1;
      index = index + 1;
    } while (index != iVar3);
  }
  aVar2 = this->field_0;
  if (((undefined1  [40])aVar2 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
    value = (this->field_0)._impl_.nested_enum_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [40])aVar2 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.redacted_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestNestedMessageEnum.redacted_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x35,field_name);
    s._M_str = (char *)*puVar9;
    s._M_len = puVar9[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,s,target);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar6 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageEnum::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestNestedMessageEnum)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .proto2_unittest.MetaAnnotatedEnum direct_enum = 1;
  for (int i = 0, n = this_._internal_direct_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, static_cast<::proto2_unittest::MetaAnnotatedEnum>(this_._internal_direct_enum().Get(i)),
        target);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestMessageEnum nested_enum = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.nested_enum_, this_._impl_.nested_enum_->GetCachedSize(), target,
        stream);
  }

  // string redacted_string = 3 [debug_redact = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_redacted_string();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.TestNestedMessageEnum.redacted_string");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestNestedMessageEnum)
  return target;
}